

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

Instr * __thiscall Inline::DoCheckThisOpt(Inline *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ThisInfo TVar5;
  Func *pFVar6;
  JITTimeProfileInfo *pJVar7;
  undefined4 *puVar8;
  BailOutInstrTemplate<IR::Instr> *this_00;
  Opnd *newSrc;
  Instr *pIVar9;
  Instr *newInstr;
  Instr *instrNext;
  Instr *instr_local;
  Inline *this_local;
  
  pIVar9 = instr->m_next;
  pFVar6 = Func::GetTopFunc(instr->m_func);
  uVar3 = Func::GetSourceContextId(pFVar6);
  pFVar6 = Func::GetTopFunc(instr->m_func);
  uVar4 = Func::GetLocalFunctionId(pFVar6);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,CheckThisPhase,uVar3,uVar4);
  if (bVar2) {
    return pIVar9;
  }
  pFVar6 = Func::GetTopFunc(instr->m_func);
  uVar3 = Func::GetSourceContextId(pFVar6);
  pFVar6 = Func::GetTopFunc(instr->m_func);
  uVar4 = Func::GetLocalFunctionId(pFVar6);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,CheckThisPhase,uVar3,uVar4);
  if (!bVar2) {
    bVar2 = Func::HasProfileInfo(instr->m_func);
    if (!bVar2) {
      return pIVar9;
    }
    pJVar7 = Func::GetReadOnlyProfileInfo(instr->m_func);
    TVar5 = JITTimeProfileInfo::GetThisInfo(pJVar7);
    if (TVar5.thisType != ThisType_Simple) {
      return pIVar9;
    }
    pJVar7 = Func::GetReadOnlyProfileInfo(instr->m_func);
    bVar2 = JITTimeProfileInfo::IsCheckThisDisabled(pJVar7);
    if (bVar2) {
      return pIVar9;
    }
  }
  if (instr->m_opcode != LdThis) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1609,"(instr->m_opcode == Js::OpCode::LdThis)",
                       "instr->m_opcode == Js::OpCode::LdThis");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  bVar2 = IR::Instr::IsInlined(instr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x160a,"(instr->IsInlined())","instr->IsInlined()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (instr->m_opcode == LdThis) {
    IR::Instr::FreeSrc2(instr);
  }
  this_00 = IR::BailOutInstrTemplate<IR::Instr>::New(CheckThis,BailOutCheckThis,instr,instr->m_func)
  ;
  newSrc = IR::Instr::GetSrc1(instr);
  IR::Instr::SetSrc1(&this_00->super_Instr,newSrc);
  IR::Instr::SetByteCodeOffset(&this_00->super_Instr,instr);
  IR::Instr::InsertBefore(instr,&this_00->super_Instr);
  pIVar9 = RemoveLdThis(this,instr);
  return pIVar9;
}

Assistant:

IR::Instr *
Inline::DoCheckThisOpt(IR::Instr * instr)
{
    IR::Instr * instrNext = instr->m_next;

    if (PHASE_OFF(Js::CheckThisPhase, instr->m_func->GetTopFunc()))
    {
        return instrNext;
    }

    if (!PHASE_FORCE(Js::CheckThisPhase, instr->m_func->GetTopFunc()))
    {
        if (!instr->m_func->HasProfileInfo())
        {
            return instrNext;
        }

        if (instr->m_func->GetReadOnlyProfileInfo()->GetThisInfo().thisType != Js::ThisType_Simple)
        {
            return instrNext;
        }

        if (instr->m_func->GetReadOnlyProfileInfo()->IsCheckThisDisabled())
        {
            return instrNext;
        }
    }

    // If the instr is an inlined LdThis, try to replace it with a CheckThis
    // that will bail out if a helper call is required to get the real "this" pointer.

    Assert(instr->m_opcode == Js::OpCode::LdThis);
    Assert(instr->IsInlined());

    // Create the CheckThis. The target is the original offset, i.e., the LdThis still has to be executed.
    if(instr->m_opcode == Js::OpCode::LdThis)
    {
        instr->FreeSrc2();
    }
    IR::Instr *newInstr =
        IR::BailOutInstr::New(Js::OpCode::CheckThis, IR::BailOutCheckThis, instr, instr->m_func);
    // Just re-use the original src1 since the LdThis will usually be deleted.
    newInstr->SetSrc1(instr->GetSrc1());
    newInstr->SetByteCodeOffset(instr);
    instr->InsertBefore(newInstr);

    return this->RemoveLdThis(instr);
}